

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidgetItem *other)

{
  QTreeWidgetItemPrivate *pQVar1;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_007ea768;
  this->rtti = 0;
  QArrayDataPointer<QList<QWidgetItemData>_>::QArrayDataPointer
            (&(this->values).d,&(other->values).d);
  this->view = (QTreeWidget *)0x0;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  *(undefined8 *)((long)&(pQVar1->display).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(pQVar1->display).d.size + 1) = 0;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (other->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i;
  QArrayDataPointer<QVariant>::operator=(&(pQVar1->display).d,&(other->d->display).d);
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(const QTreeWidgetItem &other)
    : rtti(Type),
      values(other.values),
      d(new QTreeWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
    d->display = other.d->display;
}